

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O3

bool __thiscall
cmExtraSublimeTextGenerator::Open
          (cmExtraSublimeTextGenerator *this,string *bindir,string *projectName,bool dryRun)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmake *this_00;
  pointer pcVar2;
  bool bVar3;
  char *__s;
  long *plVar4;
  size_t sVar5;
  size_type *psVar6;
  long lVar7;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string filename;
  allocator_type local_d1;
  undefined1 local_d0 [32];
  string local_b0;
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *local_50 [2];
  long local_40 [2];
  
  this_00 = ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->CMakeInstance;
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"CMAKE_SUBLIMETEXT_EXECUTABLE","");
  __s = cmake::GetCacheDefinition(this_00,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((__s == (char *)0x0) || (bVar3 = cmSystemTools::IsNOTFOUND((char *)0x2905ca), bVar3)) {
    return false;
  }
  pcVar2 = (bindir->_M_dataplus)._M_p;
  local_d0._0_8_ = (pointer)(local_d0 + 0x10);
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_d0,pcVar2,pcVar2 + bindir->_M_string_length);
  std::__cxx11::string::append((char *)local_d0);
  plVar4 = (long *)std::__cxx11::string::_M_append(local_d0,(ulong)(projectName->_M_dataplus)._M_p);
  psVar6 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_90.field_2._M_allocated_capacity = *psVar6;
    local_90.field_2._8_8_ = plVar4[3];
    local_90._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar6;
    local_90._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_90._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
  psVar6 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_b0.field_2._M_allocated_capacity = *psVar6;
    local_b0.field_2._8_8_ = plVar4[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar6;
    local_b0._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_b0._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_d0._0_8_ != (pointer)(local_d0 + 0x10)) {
    operator_delete((void *)local_d0._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_d0._16_8_)->_M_p + 1));
  }
  if (dryRun) {
    bVar3 = cmsys::SystemTools::FileExists(&local_b0,true);
  }
  else {
    local_90._M_dataplus._M_p = (pointer)paVar1;
    sVar5 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,__s,__s + sVar5);
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"--project","");
    plVar4 = local_40;
    local_50[0] = plVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,local_b0._M_dataplus._M_p,
               local_b0._M_dataplus._M_p + local_b0._M_string_length);
    __l._M_len = 3;
    __l._M_array = &local_90;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_d0,__l,&local_d1);
    bVar3 = cmSystemTools::RunSingleCommand
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_d0,(string *)0x0,(string *)0x0,(int *)0x0,(char *)0x0,OUTPUT_MERGE,
                       (cmDuration)0x0,Auto);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_d0);
    lVar7 = -0x60;
    do {
      if (plVar4 != (long *)plVar4[-2]) {
        operator_delete((long *)plVar4[-2],*plVar4 + 1);
      }
      plVar4 = plVar4 + -4;
      lVar7 = lVar7 + 0x20;
    } while (lVar7 != 0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
    return bVar3;
  }
  operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  return bVar3;
}

Assistant:

bool cmExtraSublimeTextGenerator::Open(const std::string& bindir,
                                       const std::string& projectName,
                                       bool dryRun)
{
  const char* sublExecutable =
    this->GlobalGenerator->GetCMakeInstance()->GetCacheDefinition(
      "CMAKE_SUBLIMETEXT_EXECUTABLE");
  if (!sublExecutable) {
    return false;
  }
  if (cmSystemTools::IsNOTFOUND(sublExecutable)) {
    return false;
  }

  std::string filename = bindir + "/" + projectName + ".sublime-project";
  if (dryRun) {
    return cmSystemTools::FileExists(filename, true);
  }

  return cmSystemTools::RunSingleCommand(
    { sublExecutable, "--project", filename });
}